

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O0

string * bssl::GetTempDir_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  allocator<char> local_2d [19];
  allocator<char> local_1a;
  undefined1 local_19;
  char *local_18;
  char *tmpdir;
  string *ret;
  
  pcVar1 = getenv("TMPDIR");
  local_18 = pcVar1;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"/tmp/",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else {
    local_19 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,pcVar1,&local_1a);
    std::allocator<char>::~allocator(&local_1a);
    pcVar1 = (char *)std::__cxx11::string::back();
    if (*pcVar1 != '/') {
      std::__cxx11::string::push_back((char)in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

static std::string GetTempDir() {
#if defined(OPENSSL_WINDOWS)
  char buf[MAX_PATH + 1];
  DWORD len = GetTempPathA(sizeof(buf), buf);
  return std::string(buf, len);
#else
  const char *tmpdir = getenv("TMPDIR");
  if (tmpdir != nullptr && *tmpdir != '\0') {
    std::string ret = tmpdir;
    if (ret.back() != '/') {
      ret.push_back('/');
    }
    return ret;
  }
#if defined(OPENSSL_ANDROID)
  return "/data/local/tmp/";
#else
  return "/tmp/";
#endif
#endif
}